

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O3

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  uint64_t (*pauVar1) [2];
  uint64_t (*pauVar2) [2];
  bool bVar3;
  ulong uVar4;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  int iVar16;
  mbedtls_cipher_info_t *cipher_info;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint64_t (*pauVar20) [2];
  uint64_t u64h [2];
  size_t olen;
  uint64_t local_48;
  uint64_t uStack_40;
  size_t local_30;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar16 = -0x14;
  if ((((keybits == 0x80) || (keybits == 0x100)) || (keybits == 0xc0)) &&
     ((cipher_info = mbedtls_cipher_info_from_values(cipher,keybits,MBEDTLS_MODE_ECB),
      cipher_info != (mbedtls_cipher_info_t *)0x0 &&
      ((*(uint *)&cipher_info->field_0x8 & 0x1f) == 0x10)))) {
    mbedtls_cipher_free(&ctx->cipher_ctx);
    iVar16 = mbedtls_cipher_setup(&ctx->cipher_ctx,cipher_info);
    if ((iVar16 == 0) &&
       (iVar16 = mbedtls_cipher_setkey(&ctx->cipher_ctx,key,keybits,MBEDTLS_ENCRYPT), iVar16 == 0))
    {
      local_48 = 0;
      uStack_40 = 0;
      local_30 = 0;
      iVar16 = mbedtls_cipher_update
                         (&ctx->cipher_ctx,(uchar *)&local_48,0x10,(uchar *)&local_48,&local_30);
      if (iVar16 == 0) {
        ctx->acceleration = '\0';
        ctx->H[8][0] = local_48;
        ctx->H[8][1] = uStack_40;
        ctx->H[0][0] = 0;
        ctx->H[0][1] = 0;
        uVar17 = 4;
        do {
          uVar10 = uVar17 * 2;
          uVar18 = ctx->H[uVar10][1];
          uVar4 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28;
          uVar5 = uVar4 | (uVar18 & 0xff0000000000) >> 0x18;
          uVar6 = uVar5 | (uVar18 & 0xff00000000) >> 8;
          uVar7 = uVar6 | (uVar18 & 0xff000000) << 8;
          uVar8 = uVar7 | (uVar18 & 0xff0000) << 0x18;
          uVar9 = uVar8 | (uVar18 & 0xff00) << 0x28;
          ctx->H[uVar17][1] =
               (uVar18 << 0x38) >> 0x39 | ((uVar9 | uVar18 << 0x38) >> 1 & 0xff000000000000) >> 0x28
               | (uVar9 & 0x1fe0000000000) >> 0x19 | (uVar8 & 0x1fe00000000) >> 9 |
               ((uVar7 & 0x1fe000000) >> 1) << 8 | ((uVar6 & 0x1fe0000) >> 1) << 0x18 |
               ((uVar5 & 0x1fe00) >> 1) << 0x28 | ((uVar4 & 0x1fe) >> 1) << 0x38;
          *(byte *)(ctx->H[uVar17] + 1) =
               (byte)uVar18 >> 1 | *(char *)((long)ctx->H[uVar10] + 7) << 7;
          uVar18 = ctx->H[uVar10][0];
          uVar8 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28;
          uVar9 = uVar8 | (uVar18 & 0xff0000000000) >> 0x18;
          uVar7 = uVar9 | (uVar18 & 0xff00000000) >> 8;
          uVar6 = uVar7 | (uVar18 & 0xff000000) << 8;
          uVar5 = uVar6 | (uVar18 & 0xff0000) << 0x18;
          uVar4 = uVar5 | (uVar18 & 0xff00) << 0x28;
          ctx->H[uVar17][0] =
               (uVar18 << 0x38) >> 0x39 | ((uVar4 | uVar18 << 0x38) >> 1 & 0xff000000000000) >> 0x28
               | (uVar4 & 0x1fe0000000000) >> 0x19 | (uVar5 & 0x1fe00000000) >> 9 |
               ((uVar6 & 0x1fe000000) >> 1) << 8 | ((uVar7 & 0x1fe0000) >> 1) << 0x18 |
               ((uVar9 & 0x1fe00) >> 1) << 0x28 | ((uVar8 & 0x1fe) >> 1) << 0x38;
          *(byte *)ctx->H[uVar17] =
               (byte)uVar18 >> 1 ^ -(*(byte *)((long)ctx->H[uVar10] + 0xf) & 1) & 0xe1;
          bVar3 = 1 < uVar17;
          uVar17 = uVar17 >> 1;
        } while (bVar3);
        uVar17 = 8;
        do {
          uVar18 = ctx->H[uVar17][0];
          uVar8 = ctx->H[uVar17][1];
          ctx->H[uVar17][0] =
               uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
               (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
               (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28
               | uVar18 << 0x38;
          ctx->H[uVar17][1] =
               uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
               | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
               (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          bVar3 = 1 < uVar17;
          uVar17 = uVar17 >> 1;
        } while (bVar3);
        uVar17 = 2;
        do {
          uVar18 = (ulong)uVar17;
          pauVar1 = ctx->H + uVar18;
          lVar19 = uVar18 - 1;
          pauVar20 = ctx->H;
          do {
            pauVar20 = pauVar20 + 1;
            uVar10 = *(uint *)((long)*pauVar1 + 4);
            uVar14 = (*pauVar1)[1];
            uVar11 = *(uint *)((long)*pauVar1 + 0xc);
            uVar12 = *(uint *)((long)*pauVar20 + 4);
            uVar15 = (*pauVar20)[1];
            uVar13 = *(uint *)((long)*pauVar20 + 0xc);
            pauVar2 = pauVar20 + uVar18;
            *(uint *)*pauVar2 = (uint)(*pauVar20)[0] ^ (uint)(*pauVar1)[0];
            *(uint *)((long)*pauVar2 + 4) = uVar12 ^ uVar10;
            *(uint *)(*pauVar2 + 1) = (uint)uVar15 ^ (uint)uVar14;
            *(uint *)((long)*pauVar2 + 0xc) = uVar13 ^ uVar11;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
          uVar17 = uVar17 * 2;
        } while ((int)uVar17 < 0x10);
        iVar16 = 0;
      }
    }
  }
  return iVar16;
}

Assistant:

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,
                       mbedtls_cipher_id_t cipher,
                       const unsigned char *key,
                       unsigned int keybits)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (keybits != 128 && keybits != 192 && keybits != 256) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    mbedtls_block_cipher_free(&ctx->block_cipher_ctx);

    if ((ret = mbedtls_block_cipher_setup(&ctx->block_cipher_ctx, cipher)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_block_cipher_setkey(&ctx->block_cipher_ctx, key, keybits)) != 0) {
        return ret;
    }
#else
    const mbedtls_cipher_info_t *cipher_info;

    cipher_info = mbedtls_cipher_info_from_values(cipher, keybits,
                                                  MBEDTLS_MODE_ECB);
    if (cipher_info == NULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (mbedtls_cipher_info_get_block_size(cipher_info) != 16) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    mbedtls_cipher_free(&ctx->cipher_ctx);

    if ((ret = mbedtls_cipher_setup(&ctx->cipher_ctx, cipher_info)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_cipher_setkey(&ctx->cipher_ctx, key, keybits,
                                     MBEDTLS_ENCRYPT)) != 0) {
        return ret;
    }
#endif

    if ((ret = gcm_gen_table(ctx)) != 0) {
        return ret;
    }

    return 0;
}